

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::Clara::Detail::
BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2873:18)>
::setFlag(BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2873:18)>
          *this,bool flag)

{
  ParserResult *in_RDI;
  
  *(this->m_lambda).showHelpFlag = flag;
  *(undefined8 *)
   &(in_RDI->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.m_type =
       0x200000000;
  (in_RDI->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_00323948;
  (in_RDI->m_errorMessage)._M_dataplus._M_p = (pointer)&(in_RDI->m_errorMessage).field_2;
  (in_RDI->m_errorMessage)._M_string_length = 0;
  (in_RDI->m_errorMessage).field_2._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

auto setFlag( bool flag ) -> ParserResult override {
                    return LambdaInvoker<typename UnaryLambdaTraits<
                        L>::ReturnType>::invoke( m_lambda, flag );
                }